

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

FrameBuffer * __thiscall Imf_2_5::OutputFile::frameBuffer(OutputFile *this)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    pDVar1 = this->_data;
    pthread_mutex_unlock(__mutex);
    return &pDVar1->frameBuffer;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const FrameBuffer &
OutputFile::frameBuffer () const
{
    Lock lock (*_data->_streamData);
    return _data->frameBuffer;
}